

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O0

void __thiscall UIDisplayer::drawStartScreen(UIDisplayer *this)

{
  PrimitiveDisplayer *this_00;
  float height;
  float width;
  Colour *colour;
  GLfloat height_00;
  double dVar1;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  float local_18;
  float local_14;
  GLfloat rectHeight;
  GLfloat rectWidth;
  UIDisplayer *this_local;
  
  local_14 = 29.0;
  local_18 = 10.0;
  _rectHeight = this;
  glPushMatrix();
  dVar1 = (double)((this->height - local_18 * 20.0) * 0.5) + 7.5;
  glTranslatef((this->width - local_14 * 20.0) * 0.5,
               CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0);
  width = local_14;
  height = local_18;
  this_00 = this->primitiveDisplayer;
  colour = Palette::getColour(this->palette,0);
  PrimitiveDisplayer::drawRectangleOutline(this_00,20.0,width,height,colour);
  glPopMatrix();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"TETRIS",&local_39);
  drawParagraph(this,&local_38,this->height * 0.5 + 35.0,15.0,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"PRESS SPACE TO START",&local_71);
  height_00 = linebreak(this,this->height * 0.5 + 35.0,15.0);
  drawParagraph(this,&local_70,height_00,4.0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void UIDisplayer::drawStartScreen(void) {
    GLfloat rectWidth = 29;
    GLfloat rectHeight = 10;

    glPushMatrix();
        glTranslatef((width - rectWidth * 20) / 2, 7.5 + (height - rectHeight * 20)/2, 0);
        primitiveDisplayer->drawRectangleOutline(20, rectWidth, rectHeight, palette->getColour(Palette::GREEN));
    glPopMatrix();
    
    drawParagraph("TETRIS", height/2 + 35, 15, true);
    drawParagraph("PRESS SPACE TO START", linebreak(height/2 + 35, 15), 4);
}